

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer> *
JsUtil::
List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>::
New(Recycler *alloc,int increment)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *this;
  undefined4 *puVar4;
  List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
  *pLVar5;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  local_50 = (undefined1  [8])
             &List<Js::Utf8SourceInfo*,Memory::Recycler,false,Js::CopyRemovePolicy,RecyclerPointerComparer>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_278496;
  data.filename._0_4_ = 0x12e;
  this = Memory::Recycler::TrackAllocInfo(alloc,(TrackAllocData *)local_50);
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1ef,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_008a7870;
    *puVar4 = 0;
  }
  pLVar5 = (List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
            *)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                        (this,0x30);
  if (pLVar5 == (List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
                 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1f2,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_008a7870:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  (pLVar5->super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>).
  alloc = alloc;
  (pLVar5->super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014e1e20;
  pLVar5->increment = increment;
  (pLVar5->super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>).
  buffer.ptr = (WriteBarrierPtr<Js::Utf8SourceInfo> *)0x0;
  (pLVar5->super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>).
  count = 0;
  pLVar5->length = 0;
  return pLVar5;
}

Assistant:

static List * New(TAllocator * alloc, int increment = DefaultIncrement)
        {
            return AllocatorNew(TAllocator, alloc, List, alloc, increment);
        }